

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

QList<QString> *
waitForValue<QList<QString>>
          (QList<QString> *__return_storage_ptr__,QPromise<QList<QString>_> *promise,
          QList<QString> *initial)

{
  QPromise<void> local_48;
  QPromiseBase<void> local_38;
  undefined1 local_21;
  QList<QString> *local_20;
  QList<QString> *initial_local;
  QPromise<QList<QString>_> *promise_local;
  QList<QString> *value;
  
  local_21 = 0;
  local_20 = initial;
  initial_local = (QList<QString> *)promise;
  promise_local = (QPromise<QList<QString>_> *)__return_storage_ptr__;
  QList<QString>::QList(__return_storage_ptr__,initial);
  QtPromise::QPromiseBase<QList<QString>>::
  then<waitForValue<QList<QString>>(QtPromise::QPromise<QList<QString>>const&,QList<QString>const&)::_lambda(QList<QString>const&)_1_>
            ((QPromiseBase<QList<QString>> *)&local_48,(anon_class_8_1_a8c68091 *)initial_local);
  QtPromise::QPromiseBase<void>::wait(&local_38,&local_48);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_38);
  QtPromise::QPromise<void>::~QPromise(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static inline T waitForValue(const QtPromise::QPromise<T>& promise, const T& initial)
{
    T value(initial);
    promise
        .then([&](const T& res) {
            value = res;
        })
        .wait();
    return value;
}